

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O3

void __thiscall CHog::exportFeatVect(CHog *this,string *exportPath,int x,int y,int w,int h,int l)

{
  histCell **pphVar1;
  histCell *phVar2;
  long lVar3;
  void *pvVar4;
  ostream *poVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ofstream of;
  long local_278;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(exportPath->_M_dataplus)._M_p,_S_app);
  iVar10 = x + 1;
  iVar6 = h * w;
  pphVar1 = this->hist;
  lVar3 = (long)pphVar1[(long)y + 1][iVar10].dim * (long)iVar6;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (int)lVar3) {
    uVar9 = lVar3 * 8;
  }
  pvVar4 = operator_new__(uVar9);
  lVar3 = (long)y + 1;
  if (0 < h) {
    local_278 = 0;
    uVar9 = 0;
    do {
      if (0 < w) {
        phVar2 = pphVar1[lVar3 + uVar9];
        lVar11 = 0;
        lVar8 = local_278;
        do {
          lVar7 = (long)*(int *)((long)&phVar2[iVar10].dim + lVar11);
          memcpy((void *)((long)pvVar4 + lVar8 * lVar7 * 8),
                 *(void **)((long)&phVar2[iVar10].feat + lVar11),lVar7 << 3);
          lVar11 = lVar11 + 0x30;
          lVar8 = lVar8 + 1;
        } while ((ulong)(uint)w * 0x30 != lVar11);
      }
      uVar9 = uVar9 + 1;
      local_278 = local_278 + w;
    } while (uVar9 != (uint)h);
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,l);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
  if (0 < iVar6 * this->hist[lVar3][iVar10].dim) {
    lVar8 = 0;
    do {
      poVar5 = std::ostream::_M_insert<double>(*(double *)((long)pvVar4 + lVar8 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (long)this->hist[lVar3][iVar10].dim * (long)iVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  std::ofstream::close();
  operator_delete__(pvVar4);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _flush;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CHog::exportFeatVect(string exportPath, int x, int y, int w, int h, int l)
{
    ofstream of(exportPath.c_str(), ios::app);
    x += 1;
    y += 1;
    double* featVect = new double[w*h*hist[y][x].dim];
    for(int i=0; i<h; i++)
    {
        for(int j=0; j<w; j++)
            memcpy(featVect+(i*w+j)*hist[y+i][x+j].dim, hist[y+i][x+j].feat, sizeof(double)*hist[y+i][x+j].dim);
    }
    of<<l<<"\t";
    for(int n=0; n<w*h*hist[y][x].dim; n++)
//        of<<n+1<<":"<<featVect[n]<<"\t";
        of<<featVect[n]<<"\t";
    of<<"\n";
    of.close();
    delete[] featVect;
}